

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::CopyScene(aiScene **_dest,aiScene *src,bool allocate)

{
  uint uVar1;
  aiMetadata *rhs;
  aiAnimation **ppaVar2;
  aiTexture **ppaVar3;
  aiMaterial **ppaVar4;
  aiLight **ppaVar5;
  aiLight *__src;
  aiCamera **ppaVar6;
  aiCamera *__src_00;
  aiMesh **ppaVar7;
  aiScene *this;
  aiMetadata *this_00;
  aiAnimation **ppaVar8;
  aiTexture **ppaVar9;
  aiMaterial **ppaVar10;
  aiLight **ppaVar11;
  aiLight *__dest;
  aiCamera **ppaVar12;
  aiCamera *__dest_00;
  aiMesh **ppaVar13;
  undefined4 uVar14;
  ai_uint i;
  ulong uVar15;
  ulong uVar16;
  
  if (src != (aiScene *)0x0 && _dest != (aiScene **)0x0) {
    if (allocate) {
      this = (aiScene *)operator_new(0x80);
      aiScene::aiScene(this);
      *_dest = this;
    }
    else {
      this = *_dest;
    }
    rhs = src->mMetaData;
    if (rhs != (aiMetadata *)0x0) {
      this_00 = (aiMetadata *)operator_new(0x18);
      aiMetadata::aiMetadata(this_00,rhs);
      this->mMetaData = this_00;
    }
    uVar1 = src->mNumAnimations;
    this->mNumAnimations = uVar1;
    if ((ulong)uVar1 == 0) {
      this->mAnimations = (aiAnimation **)0x0;
    }
    else {
      ppaVar2 = src->mAnimations;
      uVar16 = (ulong)uVar1 << 3;
      ppaVar8 = (aiAnimation **)operator_new__(uVar16);
      this->mAnimations = ppaVar8;
      uVar15 = 0;
      do {
        Copy((aiAnimation **)((long)this->mAnimations + uVar15),
             *(aiAnimation **)((long)ppaVar2 + uVar15));
        uVar15 = uVar15 + 8;
      } while (uVar16 != uVar15);
    }
    uVar1 = src->mNumTextures;
    this->mNumTextures = uVar1;
    if ((ulong)uVar1 == 0) {
      this->mTextures = (aiTexture **)0x0;
    }
    else {
      ppaVar3 = src->mTextures;
      uVar16 = (ulong)uVar1 << 3;
      ppaVar9 = (aiTexture **)operator_new__(uVar16);
      this->mTextures = ppaVar9;
      uVar15 = 0;
      do {
        Copy((aiTexture **)((long)this->mTextures + uVar15),*(aiTexture **)((long)ppaVar3 + uVar15))
        ;
        uVar15 = uVar15 + 8;
      } while (uVar16 != uVar15);
    }
    uVar1 = src->mNumMaterials;
    this->mNumMaterials = uVar1;
    if ((ulong)uVar1 == 0) {
      this->mMaterials = (aiMaterial **)0x0;
    }
    else {
      ppaVar4 = src->mMaterials;
      uVar16 = (ulong)uVar1 << 3;
      ppaVar10 = (aiMaterial **)operator_new__(uVar16);
      this->mMaterials = ppaVar10;
      uVar15 = 0;
      do {
        Copy((aiMaterial **)((long)this->mMaterials + uVar15),
             *(aiMaterial **)((long)ppaVar4 + uVar15));
        uVar15 = uVar15 + 8;
      } while (uVar16 != uVar15);
    }
    uVar15 = (ulong)src->mNumLights;
    this->mNumLights = src->mNumLights;
    if (uVar15 == 0) {
      this->mLights = (aiLight **)0x0;
    }
    else {
      ppaVar5 = src->mLights;
      ppaVar11 = (aiLight **)operator_new__(uVar15 * 8);
      this->mLights = ppaVar11;
      uVar16 = 0;
      do {
        ppaVar11 = this->mLights;
        if ((ppaVar11 != (aiLight **)0x0) && (__src = ppaVar5[uVar16], __src != (aiLight *)0x0)) {
          __dest = (aiLight *)operator_new(0x46c);
          ppaVar11[uVar16] = __dest;
          memcpy(__dest,__src,0x46c);
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    uVar15 = (ulong)src->mNumCameras;
    this->mNumCameras = src->mNumCameras;
    if (uVar15 == 0) {
      this->mCameras = (aiCamera **)0x0;
    }
    else {
      ppaVar6 = src->mCameras;
      ppaVar12 = (aiCamera **)operator_new__(uVar15 * 8);
      this->mCameras = ppaVar12;
      uVar16 = 0;
      do {
        ppaVar12 = this->mCameras;
        if ((ppaVar12 != (aiCamera **)0x0) &&
           (__src_00 = ppaVar6[uVar16], __src_00 != (aiCamera *)0x0)) {
          __dest_00 = (aiCamera *)operator_new(0x438);
          ppaVar12[uVar16] = __dest_00;
          memcpy(__dest_00,__src_00,0x438);
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    uVar1 = src->mNumMeshes;
    this->mNumMeshes = uVar1;
    if ((ulong)uVar1 == 0) {
      this->mMeshes = (aiMesh **)0x0;
    }
    else {
      ppaVar7 = src->mMeshes;
      uVar16 = (ulong)uVar1 << 3;
      ppaVar13 = (aiMesh **)operator_new__(uVar16);
      this->mMeshes = ppaVar13;
      uVar15 = 0;
      do {
        Copy((aiMesh **)((long)this->mMeshes + uVar15),*(aiMesh **)((long)ppaVar7 + uVar15));
        uVar15 = uVar15 + 8;
      } while (uVar16 != uVar15);
    }
    Copy(&this->mRootNode,src->mRootNode);
    this->mFlags = src->mFlags;
    if (this->mPrivate != (void *)0x0) {
      if (src->mPrivate == (void *)0x0) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(undefined4 *)((long)src->mPrivate + 8);
      }
      *(undefined4 *)((long)this->mPrivate + 8) = uVar14;
    }
  }
  return;
}

Assistant:

void SceneCombiner::CopyScene(aiScene** _dest,const aiScene* src,bool allocate) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    if (allocate) {
        *_dest = new aiScene();
    }
    aiScene* dest = *_dest;
    ai_assert(nullptr != dest);

    // copy metadata
    if ( nullptr != src->mMetaData ) {
        dest->mMetaData = new aiMetadata( *src->mMetaData );
    }

    // copy animations
    dest->mNumAnimations = src->mNumAnimations;
    CopyPtrArray(dest->mAnimations,src->mAnimations,
        dest->mNumAnimations);

    // copy textures
    dest->mNumTextures = src->mNumTextures;
    CopyPtrArray(dest->mTextures,src->mTextures,
        dest->mNumTextures);

    // copy materials
    dest->mNumMaterials = src->mNumMaterials;
    CopyPtrArray(dest->mMaterials,src->mMaterials,
        dest->mNumMaterials);

    // copy lights
    dest->mNumLights = src->mNumLights;
    CopyPtrArray(dest->mLights,src->mLights,
        dest->mNumLights);

    // copy cameras
    dest->mNumCameras = src->mNumCameras;
    CopyPtrArray(dest->mCameras,src->mCameras,
        dest->mNumCameras);

    // copy meshes
    dest->mNumMeshes = src->mNumMeshes;
    CopyPtrArray(dest->mMeshes,src->mMeshes,
        dest->mNumMeshes);

    // now - copy the root node of the scene (deep copy, too)
    Copy( &dest->mRootNode, src->mRootNode);

    // and keep the flags ...
    dest->mFlags = src->mFlags;

    // source private data might be NULL if the scene is user-allocated (i.e. for use with the export API)
    if (dest->mPrivate != NULL) {
        ScenePriv(dest)->mPPStepsApplied = ScenePriv(src) ? ScenePriv(src)->mPPStepsApplied : 0;
    }
}